

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::ShiftHelper<double>(JavascriptArray *pArr,ScriptContext *scriptContext)

{
  Type *addr;
  SparseArraySegmentBase *seg;
  Recycler *recycler;
  SparseArraySegmentBase *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  undefined4 *puVar8;
  SparseArraySegmentBase *pSVar9;
  uint uVar10;
  SparseArraySegmentBase *pSVar11;
  
  pSVar11 = (pArr->head).ptr;
  seg = (pSVar11->next).ptr;
  if (seg != (SparseArraySegmentBase *)0x0) {
    recycler = scriptContext->recycler;
    addr = &pArr->head;
    pSVar9 = seg;
    do {
      pSVar9->left = pSVar9->left - 1;
      pSVar9 = (pSVar9->next).ptr;
    } while (pSVar9 != (SparseArraySegmentBase *)0x0);
    uVar6 = pSVar11->size;
    uVar10 = seg->left;
    if (uVar6 <= uVar10) goto LAB_00b8df54;
    if (pSVar11->left != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1722,"(pArr->head->left == 0)",
                                  "Array always points to a head starting at index 0");
      if (!bVar3) goto LAB_00b8df6e;
      *puVar8 = 0;
      pSVar11 = addr->ptr;
      uVar6 = pSVar11->size;
      uVar10 = seg->left;
    }
    if (uVar6 != uVar10 + 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1723,"(pArr->head->size == next->left + 1)",
                                  "Shift next->left overlaps current segment by more than 1 element"
                                 );
      if (!bVar3) goto LAB_00b8df6e;
      *puVar8 = 0;
      pSVar11 = addr->ptr;
    }
    bVar3 = IsInlineSegment(pSVar11,pArr);
    bVar4 = IsInlineSegment(seg,pArr);
    pSVar9 = pSVar11;
    if (seg->length != 0) {
      uVar6 = pSVar11->size;
      pSVar1 = (seg->next).ptr;
      if (pSVar1 == (SparseArraySegmentBase *)0x0) {
        pSVar9 = &SparseArraySegment<double>::GrowByMin
                            ((SparseArraySegment<double> *)pSVar11,recycler,seg->length - 1)->
                  super_SparseArraySegmentBase;
      }
      else {
        uVar10 = pSVar1->left;
        uVar7 = uVar6;
        if (uVar10 < uVar6) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1737,"(next->next->left >= head->size)",
                                      "next->next->left >= head->size");
          if (!bVar5) goto LAB_00b8df6e;
          *puVar8 = 0;
          uVar10 = ((seg->next).ptr)->left;
          uVar7 = pSVar11->size;
        }
        if (uVar10 - uVar7 == 0) {
          if (seg->length != 1) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar8 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x1740,"(next->length == 1)","next->length == 1");
            if (!bVar5) {
LAB_00b8df6e:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar8 = 0;
          }
        }
        else {
          pSVar9 = &SparseArraySegment<double>::GrowByMinMax
                              ((SparseArraySegment<double> *)pSVar11,recycler,seg->length - 1,
                               uVar10 - uVar7)->super_SparseArraySegmentBase;
        }
      }
      uVar10 = seg->length;
      memmove_xplat(&pSVar9[1].left + (ulong)(uVar6 - 1) * 2,seg + 1,(ulong)uVar10 * 8);
      if ((g_verifyIsNotBarrierAddress != (code *)0x0 & DAT_015bf41c) == 1) {
        (*g_verifyIsNotBarrierAddress)(&pSVar9[1].left + (ulong)(uVar6 - 1) * 2,(ulong)uVar10);
      }
      pSVar9->length = (uVar6 - 1) + seg->length;
      SparseArraySegmentBase::CheckLengthvsSize(pSVar9);
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = pSVar9;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      if (bVar3 && pSVar11 != pSVar9) {
        (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                  (pArr,pSVar11,0);
      }
    }
    pSVar11 = (seg->next).ptr;
    Memory::Recycler::WBSetBit((char *)&pSVar9->next);
    (pSVar9->next).ptr = pSVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pSVar9->next);
    if (bVar4) {
      (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])(pArr,seg,0);
    }
    SetLastUsedSegment(pArr,(pArr->head).ptr);
    ClearSegmentMap(pArr);
  }
LAB_00b8df54:
  (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(pArr);
  return;
}

Assistant:

void JavascriptArray::ShiftHelper(JavascriptArray* pArr, ScriptContext * scriptContext)
    {
        Recycler * recycler = scriptContext->GetRecycler();

        SparseArraySegment<T>* next = SparseArraySegment<T>::From(pArr->head->next);
        while (next)
        {
            next->left--;
            next = SparseArraySegment<T>::From(next->next);
        }

        // head and next might overlap as the next segment left is decremented
        next = SparseArraySegment<T>::From(pArr->head->next);
        if (next && (pArr->head->size > next->left))
        {
            AssertMsg(pArr->head->left == 0, "Array always points to a head starting at index 0");
            AssertMsg(pArr->head->size == next->left + 1, "Shift next->left overlaps current segment by more than 1 element");

            SparseArraySegment<T> *head = SparseArraySegment<T>::From(pArr->head);
            SparseArraySegment<T> *oldHead = head;
            bool isInlineSegment = JavascriptArray::IsInlineSegment(head, pArr);
            bool nextIsInlineSegment = JavascriptArray::IsInlineSegment(next, pArr);
            // Merge the two adjacent segments
            if (next->length != 0)
            {
                uint32 offset = head->size - 1;
                // There is room for one unshifted element in head segment.
                // Hence it's enough if we grow the head segment by next->length - 1

                if (next->next)
                {
                    // If we have a next->next, we can't grow pass the left of that

                    // If the array had a segment map before, the next->next might just be right after next as well.
                    // So we just need to grow to the end of the next segment
                    // TODO: merge that segment too?
                    Assert(next->next->left >= head->size);
                    uint32 maxGrowSize = next->next->left - head->size;
                    if (maxGrowSize != 0)
                    {
                        head = head->GrowByMinMax(recycler, next->length - 1, maxGrowSize); //-1 is to account for unshift
                    }
                    else
                    {
                        // The next segment is only of length one, so we already have space in the header to copy that
                        Assert(next->length == 1);
                    }
                }
                else
                {
                    head = head->GrowByMin(recycler, next->length - 1); //-1 is to account for unshift
                }
                MoveArray(head->elements + offset, next->elements, next->length);
                head->length = offset + next->length;
                head->CheckLengthvsSize();
                pArr->head = head;

                if (isInlineSegment && oldHead != head)
                {
                    pArr->ClearElements(oldHead, 0);
                }
            }
            head->next = next->next;
            if (nextIsInlineSegment)
            {
                pArr->ClearElements(next, 0);
            }

            pArr->InvalidateLastUsedSegment();
            pArr->ClearSegmentMap();
        }

#ifdef VALIDATE_ARRAY
            pArr->ValidateArray();
#endif
    }